

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileutils.c
# Opt level: O1

void read_request(void)

{
  FILE *fp;
  X509_REQ *pXVar1;
  PKCS7_ISSUER_AND_SUBJECT *pPVar2;
  PKCS7_ISSUER_AND_SERIAL *pPVar3;
  char *pcVar4;
  int in_ESI;
  FILE *in_RDI;
  
  if (r_flag != 0) {
    in_ESI = 0x110ad2;
    in_RDI = (FILE *)r_char;
    fp = fopen(r_char,"r");
    if (fp != (FILE *)0x0) {
      in_ESI = 0x116740;
      in_RDI = fp;
      pXVar1 = PEM_read_X509_REQ(fp,(X509_REQ **)&request,(undefined1 *)0x0,(void *)0x0);
      if (pXVar1 != (X509_REQ *)0x0) {
        fclose(fp);
        return;
      }
      goto LAB_0010e6a0;
    }
  }
  read_request_cold_2();
LAB_0010e6a0:
  read_request_cold_1();
  memset(in_RDI,0,0xd8);
  *(undefined4 *)&in_RDI->_IO_write_base = 99;
  in_RDI->_IO_write_ptr = (char *)0x0;
  in_RDI->_IO_buf_base = (char *)0x0;
  pPVar2 = PKCS7_ISSUER_AND_SUBJECT_new();
  in_RDI->__pad2 = pPVar2;
  pPVar3 = PKCS7_ISSUER_AND_SERIAL_new();
  in_RDI->__pad3 = pPVar3;
  pPVar3 = PKCS7_ISSUER_AND_SERIAL_new();
  in_RDI->__pad4 = pPVar3;
  if (in_ESI == 3) {
    pcVar4 = key_fingerprint(request);
  }
  else {
    pcVar4 = "SSCEP transactionId";
  }
  in_RDI->_IO_buf_end = pcVar4;
  if (v_flag != 0) {
    printf("%s: transaction id: %s\n",pname,in_RDI->_IO_buf_end);
  }
  return;
}

Assistant:

void
read_request(void) {
	FILE *reqfile;

	/* Read certificate request file */
	if (!r_flag || 
#ifdef WIN32
		(fopen_s(&reqfile, r_char, "r")))
#else
		!(reqfile = fopen(r_char, "r")))
#endif
	{
		fprintf(stderr, "%s: cannot open certificate request\n", pname);
		exit (SCEP_PKISTATUS_FILE);
	}
	if (!PEM_read_X509_REQ(reqfile, &request, NULL, NULL)) {
		fprintf(stderr, "%s: error while reading request file\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_FILE);
	}
	fclose(reqfile);
}